

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_168::BestCastFinder::handleRefinement(BestCastFinder *this,Expression *curr)

{
  Module *pMVar1;
  Expression **ppEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Expression *local_40;
  BestCastFinder *local_38;
  
  pMVar1 = (this->
           super_LinearExecutionWalker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
           ).
           super_PostWalker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
           .currModule;
  pEVar3 = curr;
  local_38 = this;
  do {
    pEVar4 = pEVar3;
    local_40 = pEVar4;
    ppEVar2 = Properties::getImmediateFallthroughPtr(&local_40,&this->options,pMVar1,NoTeeBrIf);
    pEVar3 = *ppEVar2;
  } while (*ppEVar2 != pEVar4);
  if (pEVar4->_id == LocalSetId) {
    updateBestCast(local_38,curr,*(Index *)(pEVar4 + 1));
  }
  pMVar1 = (local_38->
           super_LinearExecutionWalker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
           ).
           super_PostWalker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
           .currModule;
  do {
    pEVar3 = pEVar4;
    local_40 = pEVar3;
    ppEVar2 = Properties::getImmediateFallthroughPtr(&local_40,&this->options,pMVar1,AllowTeeBrIf);
    pEVar4 = *ppEVar2;
  } while (*ppEVar2 != pEVar3);
  if (pEVar3->_id == LocalGetId) {
    updateBestCast(local_38,curr,*(Index *)(pEVar3 + 1));
  }
  return;
}

Assistant:

void handleRefinement(Expression* curr) {
    auto* teeFallthrough = Properties::getFallthrough(
      curr, options, *getModule(), Properties::FallthroughBehavior::NoTeeBrIf);
    if (auto* tee = teeFallthrough->dynCast<LocalSet>()) {
      updateBestCast(curr, tee->index);
    }
    auto* fallthrough =
      Properties::getFallthrough(teeFallthrough, options, *getModule());
    if (auto* get = fallthrough->dynCast<LocalGet>()) {
      updateBestCast(curr, get->index);
    }
  }